

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O1

UBool icu_63::enumExtNames(UChar32 start,UChar32 end,UEnumCharNamesFn *fn,void *context)

{
  uint32_t uVar1;
  bool bVar2;
  UBool UVar3;
  uint16_t uVar4;
  char buffer [200];
  char local_f8 [200];
  
  if ((fn != (UEnumCharNamesFn *)0x0) && (bVar2 = end < start, start <= end)) {
    do {
      uVar4 = getExtName(start,local_f8,200);
      local_f8[uVar4] = '\0';
      if ((uVar4 != 0) &&
         (UVar3 = (*fn)(context,start,U_EXTENDED_CHAR_NAME,local_f8,(uint)uVar4), UVar3 == '\0')) {
        if (bVar2) {
          return '\x01';
        }
        return '\0';
      }
      uVar1 = start + 1;
      bVar2 = end <= start;
      start = uVar1;
    } while (end + 1U != uVar1);
  }
  return '\x01';
}

Assistant:

static UBool
enumExtNames(UChar32 start, UChar32 end,
             UEnumCharNamesFn *fn, void *context)
{
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;
        
        while(start<=end) {
            buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, U_EXTENDED_CHAR_NAME, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    }

    return TRUE;
}